

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_membuf.c
# Opt level: O2

void membuff_add_string(membuff_t *mb,char *str)

{
  size_t sVar1;
  size_t buflen;
  
  sVar1 = strlen(str);
  membuff_resize(mb,sVar1 + 1 + mb->pos);
  buflen = mb->allocated_size - mb->pos;
  if (sVar1 < buflen) {
    ravi_string_copy(mb->buf + mb->pos,str,buflen);
    mb->pos = mb->pos + sVar1;
    return;
  }
  __assert_fail("mb->allocated_size - mb->pos > len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ravi_membuf.c"
                ,0x33,"void membuff_add_string(membuff_t *, const char *)");
}

Assistant:

void membuff_add_string(membuff_t *mb, const char *str) {
  size_t len = strlen(str);
  size_t required_size = mb->pos + len + 1; /* extra byte for NULL terminator */
  membuff_resize(mb, required_size);
  assert(mb->allocated_size - mb->pos > len);
  ravi_string_copy(&mb->buf[mb->pos], str, mb->allocated_size - mb->pos);
  mb->pos += len;
}